

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonCodec.cc
# Opt level: O0

size_t __thiscall
avro::parsing::JsonDecoder<avro::parsing::SimpleParser<avro::parsing::JsonDecoderHandler>_>::mapNext
          (JsonDecoder<avro::parsing::SimpleParser<avro::parsing::JsonDecoderHandler>_> *this)

{
  Token TVar1;
  JsonParser *in_RDI;
  size_t in_stack_00000038;
  SimpleParser<avro::parsing::JsonDecoderHandler> *in_stack_00000040;
  Kind in_stack_00000284;
  SimpleParser<avro::parsing::JsonDecoderHandler> *in_stack_00000288;
  undefined8 local_8;
  
  SimpleParser<avro::parsing::JsonDecoderHandler>::processImplicitActions
            ((SimpleParser<avro::parsing::JsonDecoderHandler> *)in_RDI);
  TVar1 = json::JsonParser::peek(in_RDI);
  if (TVar1 != tkObjectEnd) {
    SimpleParser<avro::parsing::JsonDecoderHandler>::setRepeatCount
              (in_stack_00000040,in_stack_00000038);
  }
  else {
    json::JsonParser::advance(in_RDI);
    SimpleParser<avro::parsing::JsonDecoderHandler>::popRepeater(in_stack_00000040);
    SimpleParser<avro::parsing::JsonDecoderHandler>::advance(in_stack_00000288,in_stack_00000284);
  }
  local_8 = (ulong)(TVar1 != tkObjectEnd);
  return local_8;
}

Assistant:

size_t JsonDecoder<P>::mapNext()
{
    parser_.processImplicitActions();
    if (in_.peek() == JsonParser::tkObjectEnd) {
        in_.advance();
        parser_.popRepeater();
        parser_.advance(Symbol::sMapEnd);
        return 0;
    }
    parser_.setRepeatCount(1);
    return 1;
}